

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

iterator * __thiscall
linq::
IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
::begin(iterator *__return_storage_ptr__,
       IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
       *this)

{
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
  local_40;
  
  local_40.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157be0;
  local_40.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->source).source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->source).source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  iterator::iterator(__return_storage_ptr__,&local_40,true);
  local_40.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157be0;
  local_40.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_40.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(source); }